

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

Script * cfd::core::ScriptUtil::CreateP2pkhLockingScript
                   (Script *__return_storage_ptr__,Pubkey *pubkey)

{
  ByteData160 pubkey_hash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  HashUtil::Hash160((ByteData160 *)&_Stack_28,pubkey);
  CreateP2pkhLockingScript(__return_storage_ptr__,(ByteData160 *)&_Stack_28);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

Script ScriptUtil::CreateP2pkhLockingScript(const Pubkey& pubkey) {
  // create pubkey hash
  ByteData160 pubkey_hash = HashUtil::Hash160(pubkey);

  return CreateP2pkhLockingScript(pubkey_hash);
}